

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_WriteDescriptorSet_Test::
TestBody(CommandLineInterfaceTest_WriteDescriptorSet_Test *this)

{
  bool bVar1;
  char *pcVar2;
  FileDescriptorProto *pFVar3;
  string *psVar4;
  DescriptorProto *pDVar5;
  FieldDescriptorProto *pFVar6;
  char *in_R9;
  string local_200;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__1;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_3;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  int local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  string_view local_e0;
  undefined1 local_d0 [8];
  FileDescriptorSet descriptor_set;
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_WriteDescriptorSet_Test *local_10;
  CommandLineInterfaceTest_WriteDescriptorSet_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"syntax = \"proto2\";\nmessage Foo {}\n");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"bar.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             "syntax = \"proto2\";\nimport \"foo.proto\";\nmessage Bar {\n  optional Foo foo = 1;\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_40,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "protocol_compiler --descriptor_set_out=$tmpdir/descriptor_set --proto_path=$tmpdir bar.proto"
             ,&local_71);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,"descriptor_set");
  CommandLineInterfaceTest::ReadDescriptorSet
            (&this->super_CommandLineInterfaceTest,local_e0,(FileDescriptorSet *)local_d0);
  bVar1 = testing::Test::HasFatalFailure();
  if (bVar1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 1;
  }
  else {
    local_100[1] = 1;
    local_100[0] = FileDescriptorSet::file_size((FileDescriptorSet *)local_d0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_f8,"1","descriptor_set.file_size()",local_100 + 1,local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_108);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    pFVar3 = FileDescriptorSet::file((FileDescriptorSet *)local_d0,0);
    psVar4 = FileDescriptorProto::name_abi_cxx11_(pFVar3);
    testing::internal::EqHelper::
    Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_120,"\"bar.proto\"","descriptor_set.file(0).name()",
               (char (*) [10])0x1e1d7ee,psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    pFVar3 = FileDescriptorSet::file((FileDescriptorSet *)local_d0,0);
    bVar1 = FileDescriptorProto::has_source_code_info(pFVar3);
    local_141 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_140,&local_141,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_140,
                 (AssertionResult *)"descriptor_set.file(0).has_source_code_info()","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    pFVar3 = FileDescriptorSet::file((FileDescriptorSet *)local_d0,0);
    pDVar5 = FileDescriptorProto::message_type(pFVar3,0);
    psVar4 = DescriptorProto::name_abi_cxx11_(pDVar5);
    testing::internal::EqHelper::
    Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_188,"\"Bar\"","descriptor_set.file(0).message_type(0).name()",
               (char (*) [4])0x1cf1e56,psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d6,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    pFVar3 = FileDescriptorSet::file((FileDescriptorSet *)local_d0,0);
    pDVar5 = FileDescriptorProto::message_type(pFVar3,0);
    pFVar6 = DescriptorProto::field(pDVar5,0);
    psVar4 = FieldDescriptorProto::name_abi_cxx11_(pFVar6);
    testing::internal::EqHelper::
    Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_1a8,"\"foo\"",
               "descriptor_set.file(0).message_type(0).field(0).name()",(char (*) [4])0x1d63234,
               psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d7,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    pFVar3 = FileDescriptorSet::file((FileDescriptorSet *)local_d0,0);
    pDVar5 = FileDescriptorProto::message_type(pFVar3,0);
    pFVar6 = DescriptorProto::field(pDVar5,0);
    local_1c9 = FieldDescriptorProto::has_json_name(pFVar6);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_200,(internal *)local_1c8,
                 (AssertionResult *)
                 "descriptor_set.file(0).message_type(0).field(0).has_json_name()","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x9d8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_d0);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, WriteDescriptorSet) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"foo.proto\";\n"
                 "message Bar {\n"
                 "  optional Foo foo = 1;\n"
                 "}\n");

  Run("protocol_compiler --descriptor_set_out=$tmpdir/descriptor_set "
      "--proto_path=$tmpdir bar.proto");

  ExpectNoErrors();

  FileDescriptorSet descriptor_set;
  ReadDescriptorSet("descriptor_set", &descriptor_set);
  if (HasFatalFailure()) return;
  EXPECT_EQ(1, descriptor_set.file_size());
  EXPECT_EQ("bar.proto", descriptor_set.file(0).name());
  // Descriptor set should not have source code info.
  EXPECT_FALSE(descriptor_set.file(0).has_source_code_info());
  // Descriptor set should have json_name.
  EXPECT_EQ("Bar", descriptor_set.file(0).message_type(0).name());
  EXPECT_EQ("foo", descriptor_set.file(0).message_type(0).field(0).name());
  EXPECT_TRUE(descriptor_set.file(0).message_type(0).field(0).has_json_name());
}